

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  U32 lowestValid;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int *ip_00;
  int *iend;
  ulong uVar9;
  BYTE *pBVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  seqDef *psVar14;
  uint local_b0;
  uint local_ac;
  size_t offbaseFound;
  ulong local_90;
  seqStore_t *local_88;
  ZSTD_matchState_t *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint *local_50;
  long local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  pBVar10 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  local_40 = pBVar10 + uVar4;
  uVar7 = (ms->cParams).minMatch;
  uVar8 = 6;
  if (uVar7 < 6) {
    uVar8 = uVar7;
  }
  uVar7 = 4;
  if (4 < uVar8) {
    uVar7 = uVar8;
  }
  local_54 = *rep;
  ip_00 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar12 = (int)ip_00 - (int)pBVar10;
  uVar8 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_58 = iVar12 - uVar8;
  if (iVar12 - uVar4 <= uVar8) {
    local_58 = uVar4;
  }
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar4;
  }
  local_5c = rep[1];
  local_58 = iVar12 - local_58;
  local_ac = local_5c;
  if (local_58 < local_5c) {
    local_ac = 0;
  }
  local_b0 = local_54;
  if (local_58 < local_54) {
    local_b0 = 0;
  }
  ms->lazySkipping = 0;
  pInLimit = (int *)((long)src + srcSize);
  local_68 = (int *)((long)src + (srcSize - 8));
  local_70 = (int *)((long)src + (srcSize - 0x20));
  local_88 = seqStore;
  do {
    local_48 = -(ulong)local_b0;
    while( true ) {
      if (local_68 <= ip_00) {
        if (local_5c <= local_58) {
          local_5c = 0;
        }
        uVar4 = local_5c;
        if (local_b0 != 0) {
          uVar4 = local_54;
        }
        if (local_54 <= local_58) {
          uVar4 = local_5c;
          local_54 = 0;
        }
        if (local_b0 != 0) {
          local_54 = local_b0;
        }
        if (local_ac != 0) {
          uVar4 = local_ac;
        }
        *rep = local_54;
        rep[1] = uVar4;
        return (long)pInLimit - (long)src;
      }
      if (local_b0 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        if (*(int *)((long)ip_00 + local_48 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar5 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + local_48 + 5),
                             (BYTE *)pInLimit);
          uVar13 = sVar5 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar7 == 6) {
        uVar6 = ZSTD_HcFindBestMatch_noDict_6(ms,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar6 = ZSTD_HcFindBestMatch_noDict_5(ms,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar6 = ZSTD_HcFindBestMatch_noDict_4(ms,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar9 = uVar13;
      if (uVar13 < uVar6) {
        uVar9 = uVar6;
      }
      if (3 < uVar9) break;
      uVar13 = (long)ip_00 - (long)src;
      ip_00 = (int *)((long)ip_00 + (uVar13 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar13);
    }
    iend = (int *)((long)ip_00 + 1);
    local_90 = 1;
    if (uVar13 < uVar6) {
      iend = ip_00;
      local_90 = offbaseFound;
    }
    pBVar10 = (BYTE *)((long)ip_00 + 5);
    local_80 = ms;
    local_50 = rep;
    while (pBVar10 + -5 < local_68) {
      ip = (int *)(pBVar10 + -4);
      local_78 = iend;
      if (local_90 == 0) {
        local_90 = 0;
      }
      else if ((local_b0 != 0) && (*(int *)(pBVar10 + -4) == *(int *)(pBVar10 + local_48 + -4))) {
        sVar5 = ZSTD_count(pBVar10,pBVar10 + local_48,(BYTE *)pInLimit);
        uVar4 = ZSTD_highbit32((U32)local_90);
        if ((sVar5 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar9 * 3 - uVar4) + 1) < (int)(sVar5 + 4) * 3)) {
          local_90 = 1;
          local_78 = ip;
          uVar9 = sVar5 + 4;
        }
      }
      offbaseFound = 999999999;
      local_38 = pBVar10;
      if (uVar7 == 6) {
        uVar13 = ZSTD_HcFindBestMatch_noDict_6(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar13 = ZSTD_HcFindBestMatch_noDict_5(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar13 = ZSTD_HcFindBestMatch_noDict_4(local_80,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      sVar5 = offbaseFound;
      uVar4 = ZSTD_highbit32((U32)offbaseFound);
      uVar8 = ZSTD_highbit32((U32)local_90);
      iend = local_78;
      if ((uVar13 < 4) || ((int)((int)uVar13 * 4 - uVar4) <= (int)(((int)uVar9 * 4 - uVar8) + 4)))
      break;
      iend = (int *)((long)ip_00 + 1);
      ip_00 = iend;
      uVar9 = uVar13;
      local_90 = sVar5;
      pBVar10 = local_38 + 1;
    }
    rep = local_50;
    ms = local_80;
    uVar4 = local_b0;
    if (3 < local_90) {
      for (; ((src < iend && (local_40 < (BYTE *)((long)iend + (3 - local_90)))) &&
             (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)iend + (2 - local_90))));
          iend = (int *)((long)iend + -1)) {
        uVar9 = uVar9 + 1;
      }
      uVar4 = (int)local_90 - 3;
      local_ac = local_b0;
    }
    local_b0 = uVar4;
    if (local_88->maxNbSeq <=
        (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
LAB_005be73b:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_88->maxNbLit) {
LAB_005be75a:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar13 = (long)iend - (long)src;
    pBVar10 = local_88->lit;
    if (local_88->litStart + local_88->maxNbLit < pBVar10 + uVar13) {
LAB_005be779:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_005be798:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_70 < iend) {
      ZSTD_safecopyLiterals(pBVar10,(BYTE *)src,(BYTE *)iend,(BYTE *)local_70);
LAB_005be4a8:
      local_88->lit = local_88->lit + uVar13;
      if (0xffff < uVar13) {
        if (local_88->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_88->longLengthType = ZSTD_llt_literalLength;
        local_88->longLengthPos =
             (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar10 = *src;
      *(undefined8 *)(pBVar10 + 8) = uVar3;
      pBVar10 = local_88->lit;
      if (0x10 < uVar13) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar10 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar10 + 0x18) = uVar3;
        if (0x20 < (long)uVar13) {
          lVar11 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar11 + 0x20);
            uVar3 = puVar2[1];
            pBVar1 = pBVar10 + lVar11 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar3;
            puVar2 = (undefined8 *)((long)src + lVar11 + 0x30);
            uVar3 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar3;
            lVar11 = lVar11 + 0x20;
          } while (pBVar1 + 0x20 < pBVar10 + uVar13);
        }
        goto LAB_005be4a8;
      }
      local_88->lit = pBVar10 + uVar13;
    }
    psVar14 = local_88->sequences;
    psVar14->litLength = (U16)uVar13;
    psVar14->offBase = (U32)local_90;
    if (uVar9 < 3) {
LAB_005be7b7:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar9 - 3) {
      if (local_88->longLengthType != ZSTD_llt_none) {
LAB_005be7d6:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_88->longLengthType = ZSTD_llt_matchLength;
      local_88->longLengthPos = (U32)((ulong)((long)psVar14 - (long)local_88->sequencesStart) >> 3);
    }
    psVar14->mlBase = (U16)(uVar9 - 3);
    psVar14 = psVar14 + 1;
    local_88->sequences = psVar14;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar4 = local_ac;
    for (ip_00 = (int *)((long)iend + uVar9);
        ((local_ac = uVar4, src = ip_00, local_ac != 0 && (ip_00 <= local_68)) &&
        (*ip_00 == *(int *)((long)ip_00 - (ulong)local_ac)));
        ip_00 = (int *)((long)ip_00 + sVar5 + 4)) {
      sVar5 = ZSTD_count((BYTE *)(ip_00 + 1),(BYTE *)((long)ip_00 + (4 - (ulong)local_ac)),
                         (BYTE *)pInLimit);
      if (local_88->maxNbSeq <= (ulong)((long)psVar14 - (long)local_88->sequencesStart >> 3))
      goto LAB_005be73b;
      if (0x20000 < local_88->maxNbLit) goto LAB_005be75a;
      pBVar10 = local_88->lit;
      if (local_88->litStart + local_88->maxNbLit < pBVar10) goto LAB_005be779;
      if (pInLimit < ip_00) goto LAB_005be798;
      if (local_70 < ip_00) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)ip_00,(BYTE *)ip_00,(BYTE *)local_70);
      }
      else {
        uVar3 = *(undefined8 *)(ip_00 + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)ip_00;
        *(undefined8 *)(pBVar10 + 8) = uVar3;
      }
      psVar14 = local_88->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (sVar5 + 4 < 3) goto LAB_005be7b7;
      if (0xffff < sVar5 + 1) {
        if (local_88->longLengthType != ZSTD_llt_none) goto LAB_005be7d6;
        local_88->longLengthType = ZSTD_llt_matchLength;
        local_88->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)local_88->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar5 + 1);
      psVar14 = psVar14 + 1;
      local_88->sequences = psVar14;
      uVar4 = local_b0;
      local_b0 = local_ac;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}